

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O2

void __thiscall
Glucose::Heap<Glucose::SimpSolver::ElimLt>::percolateDown
          (Heap<Glucose::SimpSolver::ElimLt> *this,int i)

{
  int y;
  int iVar1;
  bool bVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  piVar3 = (this->heap).data;
  y = piVar3[i];
  while( true ) {
    iVar5 = i * 2 + 1;
    iVar1 = (this->heap).sz;
    if (iVar1 <= iVar5) break;
    iVar6 = i * 2 + 2;
    if (iVar6 < iVar1) {
      bVar2 = SimpSolver::ElimLt::operator()(&this->lt,piVar3[iVar6],piVar3[iVar5]);
      lVar7 = (long)iVar6;
      if (!bVar2) {
        lVar7 = (long)iVar5;
        iVar6 = iVar5;
      }
    }
    else {
      lVar7 = (long)iVar5;
      iVar6 = iVar5;
    }
    bVar2 = SimpSolver::ElimLt::operator()(&this->lt,(this->heap).data[lVar7],y);
    piVar3 = (this->heap).data;
    piVar4 = (this->indices).data;
    if (!bVar2) goto LAB_00113dd8;
    iVar1 = piVar3[lVar7];
    piVar3[i] = iVar1;
    piVar4[iVar1] = i;
    i = iVar6;
  }
  piVar4 = (this->indices).data;
LAB_00113dd8:
  piVar3[i] = y;
  piVar4[y] = i;
  return;
}

Assistant:

void percolateDown(int i)
    {
        int x = heap[i];
        while (left(i) < heap.size()){
            int child = right(i) < heap.size() && lt(heap[right(i)], heap[left(i)]) ? right(i) : left(i);
            if (!lt(heap[child], x)) break;
            heap[i]          = heap[child];
            indices[heap[i]] = i;
            i                = child;
        }
        heap   [i] = x;
        indices[x] = i;
    }